

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateBuildingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  if (*(int *)(*(long *)(this->descriptor_ + 0x30) + 0x8c) != 3) {
    io::Printer::Print(printer,&this->variables_,
                       "if ($get_has_field_bit_from_local$) {\n  $set_has_field_bit_to_local$;\n}\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,"result.$name$_ = $name$_;\n");
  return;
}

Assistant:

void ImmutableStringFieldGenerator::
GenerateBuildingCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    printer->Print(variables_,
      "if ($get_has_field_bit_from_local$) {\n"
      "  $set_has_field_bit_to_local$;\n"
      "}\n");
  }
  printer->Print(variables_,
    "result.$name$_ = $name$_;\n");
}